

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_view.h
# Opt level: O1

void __thiscall
bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
::increment(packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
            *this,size_t begin,size_t end,size_t n,overflow_opt opt)

{
  ulong end_00;
  undefined1 auVar1 [16];
  word_type wVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong begin_00;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar6 = this->_width;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6;
  uVar8 = 0x40 - SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x40)) % auVar1,0);
  uVar7 = (end - begin) * uVar6;
  uVar4 = uVar7 % uVar8;
  begin_00 = begin * uVar6;
  if (begin_00 < uVar6 * end) {
    do {
      uVar6 = uVar4;
      if (uVar8 <= uVar7) {
        uVar6 = uVar8;
      }
      end_00 = uVar6 + begin_00;
      wVar2 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
              get(&this->_bits,begin_00,end_00);
      uVar5 = 0xffffffffffffffff >> ((ulong)(byte)-(char)uVar6 & 0x3f);
      uVar3 = this->_field_mask * n & uVar5;
      if (uVar6 == 0) {
        uVar3 = 0;
      }
      wVar2 = uVar3 + wVar2 & uVar5;
      if (uVar6 == 0) {
        wVar2 = 0;
      }
      bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::set
                (&this->_bits,begin_00,end_00,wVar2);
      uVar7 = uVar7 - uVar6;
      begin_00 = end_00;
    } while (end_00 < this->_width * end);
  }
  return;
}

Assistant:

void packed_view<C>::increment(size_t begin, size_t end,
                                       size_t n, overflow_opt opt)
        {
            size_t fields_per_word = W / width();
            size_t bits_per_word = fields_per_word * width(); // It's not useless
            size_t len = (end - begin) * width();
            size_t rem = len % bits_per_word;
            
            for(size_t step, p = begin * width();
                p < end * width();
                len -= step, p += step)
            {
                step = len < bits_per_word ? rem : bits_per_word;
                
                word_type result = _bits.get(p, p + step) +
                lowbits(field_mask() * n, step);
                
                if(opt == cant_overflow)
                    ensure_bitsize(result, step);
                
                _bits.set(p, p + step, lowbits(result, step));
            }
        }